

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_command(connectdata *conn)

{
  void *pvVar1;
  char *local_48;
  char *local_38;
  SMTP *smtp;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x10) == 0) {
    if ((*(long *)((long)pvVar1 + 8) == 0) || (**(char **)((long)pvVar1 + 8) == '\0')) {
      local_48 = "HELP";
    }
    else {
      local_48 = *(char **)((long)pvVar1 + 8);
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",local_48);
  }
  else {
    if ((*(long *)((long)pvVar1 + 8) == 0) || (**(char **)((long)pvVar1 + 8) == '\0')) {
      local_38 = "VRFY";
    }
    else {
      local_38 = *(char **)((long)pvVar1 + 8);
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s",local_38,
                               **(undefined8 **)((long)pvVar1 + 0x10));
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,SMTP_COMMAND);
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_perform_command(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  /* Send the command */
  if(smtp->rcpt)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s %s",
                            smtp->custom && smtp->custom[0] != '\0' ?
                            smtp->custom : "VRFY",
                            smtp->rcpt->data);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    state(conn, SMTP_COMMAND);

  return result;
}